

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::InRange(Character *this,uchar x,uchar y)

{
  World *pWVar1;
  int iVar2;
  int iVar3;
  mapped_type *this_00;
  allocator<char> local_39;
  key_type local_38;
  uchar local_12;
  uchar local_11;
  uchar y_local;
  Character *pCStack_10;
  uchar x_local;
  Character *this_local;
  
  local_12 = y;
  local_11 = x;
  pCStack_10 = this;
  iVar2 = util::path_length((uint)this->x,(uint)this->y,(uint)x,(uint)y);
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SeeDistance",&local_39);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::at(&(pWVar1->config).
                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ,&local_38);
  iVar3 = util::variant::operator_cast_to_int(this_00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return iVar2 <= iVar3;
}

Assistant:

bool Character::InRange(unsigned char x, unsigned char y) const
{
	return util::path_length(this->x, this->y, x, y) <= static_cast<int>(this->world->config.at("SeeDistance"));
}